

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
index_key_value<jsoncons::json_object_arg_t_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this,key_type *Name,int64_t Index,json_object_arg_t *args,semantic_tag *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>> iVar2;
  pointer pcVar3;
  undefined8 uVar4;
  void *pvVar5;
  
  *(index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>> **)this
       = this + 0x10;
  pcVar3 = (Name->_M_dataplus)._M_p;
  paVar1 = &Name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&Name->field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar4;
  }
  else {
    *(pointer *)this = pcVar3;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = Name->_M_string_length;
  (Name->_M_dataplus)._M_p = (pointer)paVar1;
  Name->_M_string_length = 0;
  (Name->field_2)._M_local_buf[0] = '\0';
  *(int64_t *)(this + 0x20) = Index;
  iVar2 = (index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>)
          *args_1;
  pvVar5 = operator_new(0x20);
  *(undefined8 *)((long)pvVar5 + 8) = 0;
  *(undefined8 *)((long)pvVar5 + 0x10) = 0;
  *(undefined8 *)((long)pvVar5 + 0x18) = 0;
  this[0x28] = (index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                )0xd;
  this[0x29] = iVar2;
  *(void **)(this + 0x30) = pvVar5;
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }